

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_case(lyout *out,int level,lys_node *node)

{
  lys_node_case *cas;
  lys_node *sub;
  lys_node *plStack_20;
  int flag;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._4_4_ = 0;
  plStack_20 = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  if ((node->flags & 0x40) == 0) {
    ly_print(out,"%*scase %s",(ulong)(uint)(level << 1),"",node->name);
    node_local._4_4_ = node_local._4_4_ + 1;
    yang_print_snode_common
              (plStack_10,node_local._4_4_,plStack_20,plStack_20->module,(int *)((long)&sub + 4),1);
    if (node[1].name != (char *)0x0) {
      yang_print_open(plStack_10,(int *)((long)&sub + 4));
      yang_print_when(plStack_10,node_local._4_4_,plStack_20->module,(lys_when *)node[1].name);
    }
    yang_print_snode_common
              (plStack_10,node_local._4_4_,plStack_20,plStack_20->module,(int *)((long)&sub + 4),
               0x72);
  }
  else {
    sub._4_4_ = 1;
  }
  for (cas = (lys_node_case *)plStack_20->child; cas != (lys_node_case *)0x0;
      cas = (lys_node_case *)cas->next) {
    if (cas->parent == plStack_20) {
      yang_print_open(plStack_10,(int *)((long)&sub + 4));
      yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)cas,0x903f);
    }
  }
  if ((plStack_20->flags & 0x40) == 0) {
    node_local._4_4_ = node_local._4_4_ + -1;
    yang_print_close(plStack_10,node_local._4_4_,sub._4_4_);
  }
  return;
}

Assistant:

static void
yang_print_case(struct lyout *out, int level, const struct lys_node *node)
{
    int flag = 0;
    struct lys_node *sub;
    struct lys_node_case *cas = (struct lys_node_case *)node;

    if (!(node->flags & LYS_IMPLICIT)) {
        ly_print(out, "%*scase %s", LEVEL, INDENT, cas->name);
        level++;

        yang_print_snode_common(out, level, node, node->module, &flag, SNODE_COMMON_EXT);
        if (cas->when) {
            yang_print_open(out, &flag);
            yang_print_when(out, level, node->module, cas->when);
        }
        yang_print_snode_common(out, level, node, node->module, &flag,
                                SNODE_COMMON_IFF | SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
    } else {
        flag = 1;
    }

    /* print children */
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub,
                         LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                         LYS_USES | LYS_ANYDATA);
    }

    if (node->flags & LYS_IMPLICIT) {
        /* do not print anything about the case, it was implicitely added by libyang */
        return;
    }

    level--;
    yang_print_close(out, level, flag);
}